

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_do_button_text_image
                  (nk_flags *state,nk_command_buffer *out,nk_rect bounds,nk_image img,char *str,
                  int len,nk_flags align,nk_button_behavior behavior,nk_style_button *style,
                  nk_user_font *font,nk_input *in)

{
  nk_rect r;
  undefined4 in_ECX;
  long in_RDX;
  nk_user_font *in_RSI;
  nk_image *in_RDI;
  uint in_R8D;
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  long in_stack_00000020;
  nk_handle in_stack_00000028;
  nk_rect content;
  nk_rect icon;
  int ret;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined8 in_stack_ffffffffffffff78;
  nk_input *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff8c;
  nk_command_buffer *out_00;
  nk_rect *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  float in_stack_ffffffffffffffb0;
  int len_00;
  float local_1c;
  float fStack_18;
  float local_14;
  float fStack_10;
  nk_bool local_c;
  nk_flags state_00;
  
  out_00 = (nk_command_buffer *)&stack0x00000008;
  if ((((in_RSI == (nk_user_font *)0x0) || (in_stack_00000028.ptr == (void *)0x0)) ||
      (in_stack_00000020 == 0)) || (in_RDX == 0)) {
    local_c = 0;
  }
  else {
    r.y = (float)in_stack_ffffffffffffffa8;
    r.x = (float)in_stack_ffffffffffffffa4;
    r.w = (float)in_stack_ffffffffffffffac;
    r.h = in_stack_ffffffffffffffb0;
    local_c = nk_do_button((nk_flags *)in_stack_ffffffffffffff98,out_00,r,
                           (nk_style_button *)
                           CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                           in_stack_ffffffffffffff80,
                           (nk_button_behavior)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                           (nk_rect *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70))
    ;
    len_00 = (int)in_RDX;
    state_00 = (nk_flags)((ulong)out_00 >> 0x20);
    fStack_18 = (float)((ulong)in_XMM0_Qa >> 0x20);
    fStack_10 = (float)((ulong)in_XMM1_Qa >> 0x20);
    fStack_10 = fStack_10 -
                (*(float *)(in_stack_00000020 + 0x84) + *(float *)(in_stack_00000020 + 0x84));
    local_1c = (float)in_XMM0_Qa;
    if ((in_R8D & 1) == 0) {
      fVar1 = *(float *)(in_stack_00000020 + 0x80) + *(float *)(in_stack_00000020 + 0x80) + local_1c
      ;
    }
    else {
      local_14 = (float)in_XMM1_Qa;
      in_stack_ffffffffffffff8c =
           (local_1c + local_14) -
           (*(float *)(in_stack_00000020 + 0x80) + *(float *)(in_stack_00000020 + 0x80) + fStack_10)
      ;
      fVar1 = in_stack_ffffffffffffff8c;
      if (in_stack_ffffffffffffff8c < 0.0) {
        in_stack_ffffffffffffff8c = 0.0;
        fVar1 = in_stack_ffffffffffffff8c;
      }
    }
    fVar1 = *(float *)(in_stack_00000020 + 0x88) + fVar1;
    fVar2 = *(float *)(in_stack_00000020 + 0x8c) + fStack_18 + *(float *)(in_stack_00000020 + 0x84);
    fVar3 = fStack_10 -
            (*(float *)(in_stack_00000020 + 0x88) + *(float *)(in_stack_00000020 + 0x88));
    fStack_10 = fStack_10 -
                (*(float *)(in_stack_00000020 + 0x8c) + *(float *)(in_stack_00000020 + 0x8c));
    if (*(long *)(in_stack_00000020 + 0xa0) != 0) {
      (**(code **)(in_stack_00000020 + 0xa0))(in_RSI,*(undefined8 *)(in_stack_00000020 + 0x98));
    }
    nk_draw_button_text_image
              ((nk_command_buffer *)CONCAT44(fStack_10,fVar3),(nk_rect *)CONCAT44(fVar2,fVar1),
               (nk_rect *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff98,state_00,
               (nk_style_button *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
               (char *)CONCAT44(in_ECX,in_R8D),len_00,in_RSI,in_RDI);
    if (*(long *)(in_stack_00000020 + 0xa8) != 0) {
      (**(code **)(in_stack_00000020 + 0xa8))(in_RSI,*(undefined8 *)(in_stack_00000020 + 0x98));
    }
  }
  return local_c;
}

Assistant:

NK_LIB nk_bool
nk_do_button_text_image(nk_flags *state,
struct nk_command_buffer *out, struct nk_rect bounds,
struct nk_image img, const char* str, int len, nk_flags align,
enum nk_button_behavior behavior, const struct nk_style_button *style,
const struct nk_user_font *font, const struct nk_input *in)
{
int ret;
struct nk_rect icon;
struct nk_rect content;

NK_ASSERT(style);
NK_ASSERT(state);
NK_ASSERT(font);
NK_ASSERT(out);
if (!out || !font || !style || !str)
return nk_false;

ret = nk_do_button(state, out, bounds, style, in, behavior, &content);
icon.y = bounds.y + style->padding.y;
icon.w = icon.h = bounds.h - 2 * style->padding.y;
if (align & NK_TEXT_ALIGN_LEFT) {
icon.x = (bounds.x + bounds.w) - (2 * style->padding.x + icon.w);
icon.x = NK_MAX(icon.x, 0);
} else icon.x = bounds.x + 2 * style->padding.x;

icon.x += style->image_padding.x;
icon.y += style->image_padding.y;
icon.w -= 2 * style->image_padding.x;
icon.h -= 2 * style->image_padding.y;

if (style->draw_begin) style->draw_begin(out, style->userdata);
nk_draw_button_text_image(out, &bounds, &content, &icon, *state, style, str, len, font, &img);
if (style->draw_end) style->draw_end(out, style->userdata);
return ret;
}